

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O3

void __thiscall
clipp::detail::
formatting_ostream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::wrap_hard(formatting_ostream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *this,int times)

{
  ostream *poVar1;
  int iVar2;
  char *local_48;
  long local_40;
  char local_38 [16];
  
  if (times < 1) {
    return;
  }
  if ((this->paragraphSpacing_ < 1) || (this->curParagraphLines_ < this->paragraphSpacingThreshold_)
     ) {
    if (times == 1) {
      local_48 = (char *)CONCAT71(local_48._1_7_,10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this->os_,(char *)&local_48,1);
      goto LAB_001204c1;
    }
  }
  else {
    times = this->paragraphSpacing_ + 1;
  }
  poVar1 = (ostream *)this->os_;
  local_48 = local_38;
  std::__cxx11::string::_M_construct((ulong)&local_48,(char)times);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_48,local_40);
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
  this->curBlankLines_ = times + -1 + this->curBlankLines_;
LAB_001204c1:
  iVar2 = 0;
  if (1 < this->curParagraphLines_) {
    iVar2 = this->hangingIndent_;
  }
  if (this->hangingIndent_ < 1) {
    iVar2 = 0;
  }
  if (this->curCol_ <= iVar2 + this->firstCol_) {
    this->curBlankLines_ = this->curBlankLines_ + 1;
  }
  this->curCol_ = 0;
  this->curParagraphLines_ = 1;
  return;
}

Assistant:

void wrap_hard(int times = 1) {
        if(times < 1) return;

        if(paragraph_spacing() > 0 &&
           paragraph_lines() >= min_paragraph_lines_for_spacing())
        {
            times = paragraph_spacing() + 1;
        }

        if(times > 1) {
            os_ << string_type(size_type(times), '\n');
            curBlankLines_ += times - 1;
        } else {
            os_ << '\n';
        }
        if(at_begin_of_line()) {
            ++curBlankLines_;
        }
        curCol_ = 0;
        curParagraphLines_ = 1;
    }